

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O3

void __thiscall
amrex::STLtools::read_ascii_stl_file
          (STLtools *this,string *fname,Real scale,Array<Real,_3> *center,int reverse_normal)

{
  ostringstream *this_00;
  ostringstream *this_01;
  pointer pTVar1;
  Real RVar2;
  STLtools *pSVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  istream *piVar8;
  uint uVar9;
  long lVar10;
  pointer pTVar11;
  string tmp;
  Real z;
  Real y;
  Real x;
  ifstream is;
  STLtools *local_418;
  int local_40c;
  undefined1 *local_408;
  undefined8 local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  long local_3e8;
  Real local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  Print local_3c0;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    local_40c = reverse_normal;
    local_3e0 = scale;
    iVar6 = Verbose();
    if (iVar6 != 0) {
      local_3c0.os = OutStream();
      local_3c0.rank = *(int *)(DAT_00816950 + -0x30);
      this_00 = &local_3c0.ss;
      local_3c0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      *(undefined8 *)(&local_3c0.field_0x18 + *(long *)(local_3c0._16_8_ + -0x18)) =
           *(undefined8 *)(local_3c0.os + *(long *)(*(long *)local_3c0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Reading binary STL file ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(fname->_M_dataplus)._M_p,fname->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
      Print::~Print(&local_3c0);
    }
    std::ifstream::ifstream(&local_3c0,(string *)fname,_S_in);
    lVar7 = CONCAT44(local_3c0.comm,local_3c0.rank);
    if (*(int *)(&local_3c0.field_0x20 + *(long *)(lVar7 + -0x18)) != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "STLtools::read_ascii_stl_file: failed to open ",fname);
      Abort((string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      lVar7 = CONCAT44(local_3c0.comm,local_3c0.rank);
    }
    local_408 = &local_3f8;
    local_400 = 0;
    local_3f8 = 0;
    cVar4 = std::ios::widen((char)&local_3c0 + (char)*(undefined8 *)(lVar7 + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_3c0,(string *)&local_408,cVar4);
    lVar7 = *(long *)(CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18);
    uVar9 = 0;
    local_418 = this;
    if (((&local_3c0.field_0x20)[lVar7] & 2) == 0) {
      uVar9 = 0;
      do {
        cVar4 = std::ios::widen((char)&local_418 + (char)lVar7 + 'X');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_3c0,(string *)&local_408,cVar4);
        lVar7 = std::__cxx11::string::find((char *)&local_408,0x77b04b,0);
        if (lVar7 != -1) break;
        uVar9 = uVar9 + 1;
        lVar7 = *(long *)(CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18);
      } while (((&local_3c0.field_0x20)[lVar7] & 2) == 0);
      if (0x24924924 < uVar9 * -0x49249249) {
        Abort_host("may be there are blank lines in the STL file\n");
      }
    }
    pSVar3 = local_418;
    local_418->m_num_tri = uVar9 / 7;
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (&local_418->m_tri_pts_h,(ulong)(uVar9 / 7));
    pTVar11 = (pSVar3->m_tri_pts_h).m_data;
    iVar6 = Verbose();
    if (iVar6 != 0) {
      local_1b8._8_8_ = OutStream();
      this_01 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this_01);
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"    Number of triangles: ",0x19);
      std::ostream::operator<<(this_01,pSVar3->m_num_tri);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
    std::istream::seekg(&local_3c0,0,0);
    cVar4 = std::ios::widen((char)&local_3c0 +
                            (char)*(undefined8 *)(CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_3c0,(string *)&local_408,cVar4);
    if (0 < pSVar3->m_num_tri) {
      lVar7 = 0;
      do {
        cVar4 = (char)&local_3c0;
        local_3e8 = lVar7;
        cVar5 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18) + cVar4);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_3c0,(string *)&local_408,cVar5);
        cVar5 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18) + cVar4);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_3c0,(string *)&local_408,cVar5);
        lVar7 = 0;
        do {
          lVar10 = lVar7;
          piVar8 = std::operator>>((istream *)&local_3c0,(string *)&local_408);
          piVar8 = std::istream::_M_extract<double>((double *)piVar8);
          piVar8 = std::istream::_M_extract<double>((double *)piVar8);
          std::istream::_M_extract<double>((double *)piVar8);
          *(double *)((long)&(pTVar11->v1).x + lVar10) = local_3c8 * local_3e0 + center->_M_elems[0]
          ;
          *(double *)((long)&(pTVar11->v1).y + lVar10) = local_3d0 * local_3e0 + center->_M_elems[1]
          ;
          *(double *)((long)&(pTVar11->v1).z + lVar10) = local_3d8 * local_3e0 + center->_M_elems[2]
          ;
          lVar7 = lVar10 + 0x18;
        } while ((int)(lVar10 + 0x18) != 0x48);
        cVar5 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18) + cVar4);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_3c0,(string *)&local_408,cVar5);
        cVar5 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18) + cVar4);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_3c0,(string *)&local_408,cVar5);
        cVar4 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_3c0.comm,local_3c0.rank) + -0x18) + cVar4);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_3c0,(string *)&local_408,cVar4);
        if (local_40c != 0) {
          pTVar1 = (local_418->m_tri_pts_h).m_data;
          local_1b8._16_8_ = pTVar1[local_3e8].v1.z;
          local_1b8._0_8_ = pTVar1[local_3e8].v1.x;
          local_1b8._8_8_ = pTVar1[local_3e8].v1.y;
          RVar2 = pTVar1[local_3e8].v2.y;
          pTVar1[local_3e8].v1.x = pTVar1[local_3e8].v2.x;
          pTVar1[local_3e8].v1.y = RVar2;
          pTVar1[local_3e8].v1.z = pTVar1[local_3e8].v2.z;
          pTVar1[local_3e8].v2.x = (Real)local_1b8._0_8_;
          pTVar1[local_3e8].v2.y = (Real)local_1b8._8_8_;
          pTVar1[local_3e8].v2.z = (Real)local_1b8._16_8_;
        }
        pTVar11 = (pointer)((long)&(pTVar11->v2).x + lVar10);
        lVar7 = local_3e8 + 1;
      } while (lVar7 < local_418->m_num_tri);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
    }
    std::ifstream::~ifstream(&local_3c0);
  }
  return;
}

Assistant:

void
STLtools::read_ascii_stl_file (std::string const& fname, Real scale,
                               Array<Real,3> const& center, int reverse_normal)
{
    if (ParallelDescriptor::IOProcessor()) {
        if (amrex::Verbose()) {
            Print() << "Reading binary STL file "<< fname << "\n";
        }

        std::ifstream is(fname, std::istringstream::in);
        if (!is.good()) {
            amrex::Abort("STLtools::read_ascii_stl_file: failed to open " + fname);
        }

        std::string tmp;
        int nlines=0;

        std::getline(is,tmp); //solid <solidname>
        while(!is.eof())
        {
            std::getline(is,tmp);
            if(tmp.find("endsolid")!=std::string::npos)
            {
                break;
            }
            nlines++;
        }

        constexpr int nlines_per_facet=7; //specific to ASCII STLs
        if(nlines%nlines_per_facet!=0)
        {
            Abort("may be there are blank lines in the STL file\n");
        }

        m_num_tri = nlines / nlines_per_facet;
        m_tri_pts_h.resize(m_num_tri);
        static_assert(sizeof(Triangle) == sizeof(Real)*9, "sizeof(Triangle) is wrong");
        Real* p = &(m_tri_pts_h[0].v1.x);

        if (amrex::Verbose()) {
            Print() << "    Number of triangles: " << m_num_tri << "\n";
        }

        is.seekg(0);
        std::getline(is,tmp); //solid <solidname>

        for(int i=0; i < m_num_tri; ++i)
        {
            std::getline(is,tmp); // facet normal
            std::getline(is,tmp); // outer loop

            Real x, y, z;

            for (int iv = 0; iv < 3; ++iv) { // 3 vertices
                is >> tmp >> x >> y >> z;
                *p++ = x * scale + center[0];
                *p++ = y * scale + center[1];
                *p++ = z * scale + center[2];
            }
            std::getline(is,tmp); // read \n

            std::getline(is,tmp); //end loop
            std::getline(is,tmp); //end facet

            if (reverse_normal) {
                std::swap(m_tri_pts_h[i].v1, m_tri_pts_h[i].v2);
            }
        }
    }
}